

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::Brick_ForceNumerical::Brick_ForceNumerical
          (Brick_ForceNumerical *this,ChMatrixNM<double,_8,_3> *d_,ChMatrixNM<double,_8,_3> *d0_,
          ChElementHexaANCF_3813 *element_,ChMatrixNM<double,_6,_6> *T0_,double *detJ0C_,
          ChVectorN<double,_9> *alpha_eas_,double *E_,double *v_)

{
  (this->super_ChIntegrable3D<Eigen::Matrix<double,_330,_1,_0,_330,_1>_>)._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_01181640;
  this->element = element_;
  this->d = d_;
  this->d0 = d0_;
  this->T0 = T0_;
  this->alpha_eas = alpha_eas_;
  this->detJ0C = detJ0C_;
  this->E = E_;
  this->v = v_;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&this->E_eps);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_> *)&this->Sx);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_> *)&this->Sy);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_24,_1,_3,_24>_> *)&this->Sz);
  return;
}

Assistant:

Brick_ForceNumerical::Brick_ForceNumerical(ChMatrixNM<double, 8, 3>* d_,
                                           ChMatrixNM<double, 8, 3>* d0_,
                                           ChElementHexaANCF_3813* element_,
                                           ChMatrixNM<double, 6, 6>* T0_,
                                           double* detJ0C_,
                                           ChVectorN<double, 9>* alpha_eas_,
                                           double* E_,
                                           double* v_)
    : element(element_), d(d_), d0(d0_), T0(T0_), alpha_eas(alpha_eas_), detJ0C(detJ0C_), E(E_), v(v_) {
    E_eps.setZero();

    Sx.setZero();
    Sy.setZero();
    Sz.setZero();
}